

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

void __thiscall QSqlTableModelPrivate::initRecordAndPrimaryIndex(QSqlTableModelPrivate *this)

{
  QSqlRecord *this_00;
  int size;
  long in_FS_OFFSET;
  QSqlIndex local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QSqlDatabase::record((QSqlDatabase *)&local_80,(QString *)&this->db);
  this_00 = &(this->super_QSqlQueryModelPrivate).rec;
  QSqlRecord::operator=(this_00,&local_80.super_QSqlRecord);
  QSqlRecord::~QSqlRecord(&local_80.super_QSqlRecord);
  QSqlDatabase::primaryIndex(&local_80,&this->db,&this->tableName);
  QSqlIndex::swap(&this->primaryIndex,&local_80);
  QSqlIndex::~QSqlIndex(&local_80);
  size = QSqlRecord::count(this_00);
  QSqlQueryModelPrivate::initColOffsets(&this->super_QSqlQueryModelPrivate,size);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlTableModelPrivate::initRecordAndPrimaryIndex()
{
    rec = db.record(tableName);
    primaryIndex = db.primaryIndex(tableName);
    initColOffsets(rec.count());
}